

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EVMMapping.c
# Opt level: O0

void EVM_get_insn_id(cs_struct *h,cs_insn *insn,uint id)

{
  int iVar1;
  uint in_EDX;
  uint *in_RSI;
  long in_RDI;
  
  *in_RSI = in_EDX;
  iVar1 = evm_insn_find(insns,0x100,in_EDX);
  if ((0 < iVar1) && (*(int *)(in_RDI + 0x60) != 0)) {
    *(cs_evm *)(*(long *)(in_RSI + 0x3c) + 0x58) = insns[in_EDX];
  }
  return;
}

Assistant:

void EVM_get_insn_id(cs_struct *h, cs_insn *insn, unsigned int id)
{
	insn->id = id;
#ifndef CAPSTONE_DIET
	if (evm_insn_find(insns, ARR_SIZE(insns), id) > 0) {
		if (h->detail) {
			memcpy(&insn->detail->evm, &insns[id], sizeof(insns[id]));
		}
	}
#endif
}